

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

iterator __thiscall
google::protobuf::RepeatedField<long>::erase
          (RepeatedField<long> *this,const_iterator first,const_iterator last)

{
  const_iterator plVar1;
  const_iterator __result;
  iterator plVar2;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  int in_stack_0000001c;
  RepeatedField<long> *in_stack_00000020;
  size_type first_offset;
  RepeatedField<long> *in_stack_ffffffffffffffc0;
  long *in_stack_ffffffffffffffc8;
  
  plVar1 = cbegin((RepeatedField<long> *)0x3f9f8c);
  if (in_RSI != in_RDX) {
    __result = cend(in_stack_ffffffffffffffc0);
    begin((RepeatedField<long> *)0x3f9fcd);
    std::copy<long_const*,long*>(in_RDI,in_stack_ffffffffffffffc8,__result);
    cbegin((RepeatedField<long> *)0x3f9ff9);
    Truncate(in_stack_00000020,in_stack_0000001c);
  }
  plVar2 = begin((RepeatedField<long> *)0x3fa01e);
  return plVar2 + (int)(in_RSI - (long)plVar1 >> 3);
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator first, const_iterator last) {
  size_type first_offset = first - cbegin();
  if (first != last) {
    Truncate(std::copy(last, cend(), begin() + first_offset) - cbegin());
  }
  return begin() + first_offset;
}